

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6_address.c
# Opt level: O0

LY_ERR lyplg_type_store_ipv6_address
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  lysc_range *range;
  ushort **ppuVar1;
  size_t value_00;
  anon_union_24_16_e2776397_for_lyd_value_2 *addr;
  undefined8 in_stack_ffffffffffffff78;
  char *local_78;
  ulong local_58;
  size_t i;
  lyd_value_ipv6_address *val;
  lysc_type_str *type_str;
  char *value_str;
  LY_ERR ret;
  LY_VALUE_FORMAT format_local;
  uint32_t options_local;
  size_t value_len_local;
  void *value_local;
  lysc_type *type_local;
  ly_ctx *ctx_local;
  
  value_str._4_4_ = LY_SUCCESS;
  memset(storage,0,0x28);
  addr = &storage->field_2;
  memset(addr,0,0x18);
  ret = options;
  if (addr == (anon_union_24_16_e2776397_for_lyd_value_2 *)0x0) {
    value_str._4_4_ = LY_EMEM;
  }
  else {
    storage->realtype = type;
    if (format == LY_VALUE_LYB) {
      if (value_len < 0x10) {
        value_str._4_4_ =
             ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                        "Invalid LYB ipv6-address value size %zu (expected at least 16).",value_len)
        ;
      }
      else {
        for (local_58 = 0x10; local_58 < value_len; local_58 = local_58 + 1) {
          ppuVar1 = __ctype_b_loc();
          if (((*ppuVar1)[(int)*(char *)((long)value + local_58)] & 8) == 0) {
            value_str._4_4_ =
                 ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                            "Invalid LYB ipv6-address zone character 0x%x.",
                            CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                     (int)*(char *)((long)value + local_58)));
            goto LAB_00239751;
          }
        }
        addr->dec64 = *value;
        *(undefined8 *)((long)&storage->field_2 + 8) = *(undefined8 *)((long)value + 8);
        if (value_len < 0x11) {
          *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
        }
        else {
          value_str._4_4_ =
               lydict_insert(ctx,(char *)((long)value + 0x10),value_len - 0x10,
                             (char **)((long)&storage->field_2 + 0x10));
        }
      }
    }
    else {
      value_str._4_4_ =
           lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
      if (value_str._4_4_ == LY_SUCCESS) {
        if ((options & 8) == 0) {
          if (type[1].name != (char *)0x0) {
            range = (lysc_range *)type[1].name;
            value_00 = ly_utf8len((char *)value,value_len);
            value_str._4_4_ =
                 lyplg_type_validate_range
                           (LY_TYPE_STRING,range,value_00,(char *)value,value_len,err);
            if (value_str._4_4_ != LY_SUCCESS) goto LAB_00239751;
          }
          value_str._4_4_ =
               lyplg_type_validate_patterns
                         ((lysc_pattern **)type[1].exts,(char *)value,value_len,err);
          if (value_str._4_4_ != LY_SUCCESS) goto LAB_00239751;
        }
        value_str._4_4_ =
             ipv6address_str2ip((char *)value,value_len,options,ctx,(in6_addr *)addr,
                                (char **)((long)&storage->field_2 + 0x10),err);
        if ((value_str._4_4_ == LY_SUCCESS) && (format == LY_VALUE_CANON)) {
          if ((options & 1) == 0) {
            local_78 = (char *)value;
            if (value_len == 0) {
              local_78 = "";
            }
            value_str._4_4_ = lydict_insert(ctx,local_78,value_len,&storage->_canonical);
          }
          else {
            value_str._4_4_ = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
            ret = LY_SUCCESS;
          }
        }
      }
    }
  }
LAB_00239751:
  if ((ret & LY_EMEM) != LY_SUCCESS) {
    free(value);
  }
  if (value_str._4_4_ != LY_SUCCESS) {
    lyplg_type_free_ipv6_address(ctx,storage);
  }
  return value_str._4_4_;
}

Assistant:

static LY_ERR
lyplg_type_store_ipv6_address(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    const char *value_str = value;
    struct lysc_type_str *type_str = (struct lysc_type_str *)type;
    struct lyd_value_ipv6_address *val;
    size_t i;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len < 16) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB ipv6-address value size %zu "
                    "(expected at least 16).", value_len);
            goto cleanup;
        }
        for (i = 16; i < value_len; ++i) {
            if (!isalnum(value_str[i])) {
                ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB ipv6-address zone character 0x%x.",
                        value_str[i]);
                goto cleanup;
            }
        }

        /* store IP address */
        memcpy(&val->addr, value, sizeof val->addr);

        /* store zone, if any */
        if (value_len > 16) {
            ret = lydict_insert(ctx, value_str + 16, value_len - 16, &val->zone);
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            val->zone = NULL;
        }

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(options & LYPLG_TYPE_STORE_ONLY)) {
        /* length restriction of the string */
        if (type_str->length) {
            /* value_len is in bytes, but we need number of characters here */
            ret = lyplg_type_validate_range(LY_TYPE_STRING, type_str->length, ly_utf8len(value, value_len), value, value_len, err);
            LY_CHECK_GOTO(ret, cleanup);
        }

        /* pattern restrictions */
        ret = lyplg_type_validate_patterns(type_str->patterns, value, value_len, err);
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* get the network-byte order address */
    ret = ipv6address_str2ip(value, value_len, options, ctx, &val->addr, &val->zone, err);
    LY_CHECK_GOTO(ret, cleanup);

    if (format == LY_VALUE_CANON) {
        /* store canonical value */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value_len ? value : "", value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_ipv6_address(ctx, storage);
    }
    return ret;
}